

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

int bounds_check(tgestate_t *state,vischar_t *vischar)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint8_t *puVar4;
  char cVar5;
  long lVar6;
  
  if (state->room_index == '\0') {
    uVar2 = (state->saved_mappos).pos16.u;
    puVar4 = &walls[0].maxx;
    cVar5 = -0x18;
    while (((uVar2 < (ushort)((ushort)((wall_t *)(puVar4 + -1))->minx * 8 + 2) ||
            ((ushort)((ushort)*puVar4 * 8 + 4) <= uVar2)) ||
           ((uVar3 = (state->saved_mappos).pos16.v, uVar3 < (ushort)((ushort)puVar4[1] << 3) ||
            ((((ushort)((ushort)puVar4[2] << 3 | 4) <= uVar3 ||
              (uVar3 = (state->saved_mappos).pos16.w, uVar3 < (ushort)((ushort)puVar4[3] << 3))) ||
             ((ushort)((ushort)puVar4[4] << 3 | 2) <= uVar3))))))) {
      puVar4 = puVar4 + 6;
      cVar5 = cVar5 + '\x01';
      if (cVar5 == '\0') {
        return 0;
      }
    }
    vischar->counter_and_flags = vischar->counter_and_flags ^ 0x20;
    return 1;
  }
  bVar1 = state->roomdef_dimensions_index;
  uVar2 = (state->saved_mappos).pos16.u;
  if (((((ushort)(interior_bounds_check::roomdef_dimensions[bVar1].x0 + 4) < uVar2) &&
       (uVar2 <= interior_bounds_check::roomdef_dimensions[bVar1].x1)) &&
      (uVar3 = (state->saved_mappos).pos16.v,
      interior_bounds_check::roomdef_dimensions[bVar1].y0 < uVar3)) &&
     ((int)(uint)uVar3 <= (int)(interior_bounds_check::roomdef_dimensions[bVar1].y1 - 4))) {
    if (state->roomdef_object_bounds_count != '\0') {
      lVar6 = 0;
      do {
        if (((state->roomdef_object_bounds[lVar6].x0 <= uVar2) &&
            (uVar2 < state->roomdef_object_bounds[lVar6].x1)) &&
           (((ushort)state->roomdef_object_bounds[lVar6].y0 <= (uVar3 & 0xff) &&
            ((byte)uVar3 < state->roomdef_object_bounds[lVar6].y1)))) goto LAB_001093b2;
        lVar6 = lVar6 + 1;
      } while (state->roomdef_object_bounds_count != (uint8_t)lVar6);
    }
    return 0;
  }
LAB_001093b2:
  vischar->counter_and_flags = vischar->counter_and_flags ^ 0x20;
  return 1;
}

Assistant:

int bounds_check(tgestate_t *state, vischar_t *vischar)
{
  uint8_t       iters; /* was B */
  const wall_t *wall;  /* was DE */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);

  if (state->room_index > room_0_OUTDOORS)
    return interior_bounds_check(state, vischar);

  iters = NELEMS(walls); /* All walls and fences. */
  wall  = &walls[0];
  do
  {
    uint16_t minx, maxx, miny, maxy, minheight, maxheight;

    minx      = wall->minx      * 8;
    maxx      = wall->maxx      * 8;
    miny      = wall->miny      * 8;
    maxy      = wall->maxy      * 8;
    minheight = wall->minheight * 8;
    maxheight = wall->maxheight * 8;

    if (state->saved_mappos.pos16.u >= minx + 2   &&
        state->saved_mappos.pos16.u <  maxx + 4   &&
        state->saved_mappos.pos16.v >= miny       &&
        state->saved_mappos.pos16.v <  maxy + 4   &&
        state->saved_mappos.pos16.w >= minheight  &&
        state->saved_mappos.pos16.w <  maxheight + 2)
    {
      vischar->counter_and_flags ^= vischar_BYTE7_V_DOMINANT;
      return 1; // NZ => outwith wall bounds
    }

    wall++;
  }
  while (--iters);

  return 0; // Z => within wall bounds
}